

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

void __thiscall IopSpace::saveXml(IopSpace *this,ostream *s)

{
  LowlevelError *this_00;
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  IopSpace *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Should never save iop space to XML",&local_39);
  LowlevelError::LowlevelError(this_00,(string *)local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void IopSpace::saveXml(ostream &s) const

{
  throw LowlevelError("Should never save iop space to XML");
}